

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterATT.c
# Opt level: O3

ZyanStatus
ZydisFormatterATTPrintDISP
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  ZyanUSize ZVar1;
  void *pvVar2;
  ZyanUSize ZVar3;
  ZyanStatus ZVar4;
  ZyanBool force_leading_number;
  ZyanStringView *pZVar5;
  undefined1 uVar6;
  ZyanBool uppercase;
  ZyanStringView *pZVar7;
  ZyanU64 ZVar8;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x180,
                  "ZyanStatus ZydisFormatterATTPrintDISP(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x181,
                  "ZyanStatus ZydisFormatterATTPrintDISP(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x182,
                  "ZyanStatus ZydisFormatterATTPrintDISP(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if ((buffer->is_token_list != '\0') &&
     (ZVar4 = ZydisFormatterBufferAppend(buffer,'\n'), (int)ZVar4 < 0)) {
    return ZVar4;
  }
  if (formatter->disp_signedness < ZYDIS_SIGNEDNESS_MAX_VALUE) {
    if (formatter->disp_base == ZYDIS_NUMERIC_BASE_HEX) {
      ZVar8 = (context->operand->field_10).mem.disp.value;
      uVar6 = (undefined1)formatter->disp_padding;
      uppercase = formatter->hex_uppercase;
      force_leading_number = formatter->hex_force_leading_number;
      pZVar7 = formatter->number_format[1][0].string;
      pZVar5 = formatter->number_format[1][1].string;
      if ((long)ZVar8 < 0) {
        if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) goto LAB_0011bfc0;
        ZVar1 = (buffer->string).vector.size;
        if (ZVar1 == 0) goto LAB_0011bfdf;
        if ((buffer->string).vector.capacity < ZVar1 + 1) {
          return 0x80100009;
        }
        *(undefined2 *)((long)(buffer->string).vector.data + (ZVar1 - 1)) = 0x2d;
        ZVar1 = (buffer->string).vector.size;
        pvVar2 = (buffer->string).vector.data;
        (buffer->string).vector.size = ZVar1 + 1;
        if (*(char *)((long)pvVar2 + ZVar1) != '\0') goto LAB_0011c01d;
        if (pZVar7 != (ZyanStringView *)0x0) {
          if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) goto LAB_0011c03c;
          if ((ZVar1 + 1 == 0) || (ZVar3 = (pZVar7->string).vector.size, ZVar3 == 0))
          goto LAB_0011bffe;
          if ((buffer->string).vector.capacity < ZVar3 + ZVar1) {
            return 0x80100009;
          }
          memcpy((void *)((long)pvVar2 + ZVar1),(pZVar7->string).vector.data,ZVar3 - 1);
          ZVar1 = (pZVar7->string).vector.size;
          ZVar3 = (buffer->string).vector.size;
          pvVar2 = (buffer->string).vector.data;
          (buffer->string).vector.size = (ZVar1 + ZVar3) - 1;
          *(undefined1 *)((long)pvVar2 + ZVar1 + ZVar3 + -2) = 0;
        }
        ZVar8 = -ZVar8;
        pZVar7 = (ZyanStringView *)0x0;
      }
LAB_0011bf46:
      ZVar4 = ZydisStringAppendHexU
                        (&buffer->string,ZVar8,uVar6,force_leading_number,uppercase,pZVar7,pZVar5);
      goto LAB_0011bf4b;
    }
    if (formatter->disp_base != ZYDIS_NUMERIC_BASE_DEC) {
      return 0x80100004;
    }
    ZVar8 = (context->operand->field_10).mem.disp.value;
    uVar6 = (undefined1)formatter->disp_padding;
    pZVar5 = formatter->number_format[0][0].string;
    pZVar7 = formatter->number_format[0][1].string;
    if ((long)ZVar8 < 0) {
      if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) {
LAB_0011bfc0:
        __assert_fail("!destination->vector.allocator",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0xeb,
                      "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
      }
      ZVar1 = (buffer->string).vector.size;
      if (ZVar1 == 0) {
LAB_0011bfdf:
        __assert_fail("destination->vector.size && source->size",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0xec,
                      "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
      }
      if ((buffer->string).vector.capacity < ZVar1 + 1) {
        return 0x80100009;
      }
      *(undefined2 *)((long)(buffer->string).vector.data + (ZVar1 - 1)) = 0x2d;
      ZVar1 = (buffer->string).vector.size;
      pvVar2 = (buffer->string).vector.data;
      (buffer->string).vector.size = ZVar1 + 1;
      if (*(char *)((long)pvVar2 + ZVar1) != '\0') {
LAB_0011c01d:
        __assert_fail("*(char*)((ZyanU8*)(destination)->vector.data + (destination)->vector.size - 1) == \'\\0\'"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0xf7,
                      "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
      }
      if (pZVar5 != (ZyanStringView *)0x0) {
        if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) {
LAB_0011c03c:
          __assert_fail("!destination->vector.allocator",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                        ,0x87,"ZyanStatus ZydisStringAppend(ZyanString *, const ZyanStringView *)");
        }
        if ((ZVar1 + 1 == 0) || (ZVar3 = (pZVar5->string).vector.size, ZVar3 == 0)) {
LAB_0011bffe:
          __assert_fail("destination->vector.size && source->string.vector.size",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                        ,0x88,"ZyanStatus ZydisStringAppend(ZyanString *, const ZyanStringView *)");
        }
        if ((buffer->string).vector.capacity < ZVar3 + ZVar1) {
          return 0x80100009;
        }
        memcpy((void *)((long)pvVar2 + ZVar1),(pZVar5->string).vector.data,ZVar3 - 1);
        ZVar1 = (pZVar5->string).vector.size;
        ZVar3 = (buffer->string).vector.size;
        pvVar2 = (buffer->string).vector.data;
        (buffer->string).vector.size = (ZVar1 + ZVar3) - 1;
        *(undefined1 *)((long)pvVar2 + ZVar1 + ZVar3 + -2) = 0;
      }
      ZVar8 = -ZVar8;
      pZVar5 = (ZyanStringView *)0x0;
    }
  }
  else {
    if (formatter->disp_signedness != ZYDIS_SIGNEDNESS_MAX_VALUE) {
      return 0x80100004;
    }
    if (formatter->disp_base == ZYDIS_NUMERIC_BASE_HEX) {
      ZVar8 = (context->operand->field_10).mem.disp.value;
      uVar6 = (undefined1)formatter->disp_padding;
      force_leading_number = formatter->hex_force_leading_number;
      uppercase = formatter->hex_uppercase;
      pZVar7 = formatter->number_format[1][0].string;
      pZVar5 = formatter->number_format[1][1].string;
      goto LAB_0011bf46;
    }
    if (formatter->disp_base != ZYDIS_NUMERIC_BASE_DEC) {
      return 0x80100004;
    }
    ZVar8 = (context->operand->field_10).mem.disp.value;
    uVar6 = (undefined1)formatter->disp_padding;
    pZVar5 = formatter->number_format[0][0].string;
    pZVar7 = formatter->number_format[0][1].string;
  }
  ZVar4 = ZydisStringAppendDecU(&buffer->string,ZVar8,uVar6,pZVar5,pZVar7);
LAB_0011bf4b:
  if (-1 < (int)ZVar4) {
    ZVar4 = 0x100000;
  }
  return ZVar4;
}

Assistant:

ZyanStatus ZydisFormatterATTPrintDISP(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_DISPLACEMENT);
    switch (formatter->disp_signedness)
    {
    case ZYDIS_SIGNEDNESS_AUTO:
    case ZYDIS_SIGNEDNESS_SIGNED:
        ZYDIS_STRING_APPEND_NUM_S(formatter, formatter->disp_base, &buffer->string,
            context->operand->mem.disp.value, formatter->disp_padding, 
            formatter->hex_force_leading_number, ZYAN_FALSE);
        break;
    case ZYDIS_SIGNEDNESS_UNSIGNED:
        ZYDIS_STRING_APPEND_NUM_U(formatter, formatter->disp_base, &buffer->string,
            context->operand->mem.disp.value, formatter->disp_padding, 
            formatter->hex_force_leading_number);
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    return ZYAN_STATUS_SUCCESS;
}